

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O3

bool __thiscall cmCTestBZR::LoadRevisions(cmCTestBZR *this)

{
  list<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *this_00;
  char **ppcVar1;
  cmCTest *pcVar2;
  char *__nptr;
  pointer pcVar3;
  pointer pcVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  size_type *psVar8;
  long lVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string revs;
  string bzr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bzr_log;
  ostringstream cmCTestLog_msg;
  OutputLogger local_4e0;
  undefined1 *local_4a0;
  long local_498;
  undefined1 local_490;
  undefined7 uStack_48f;
  long *local_480;
  long local_478;
  long local_470 [2];
  string local_460;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_440;
  undefined1 local_428 [32];
  undefined1 *local_408 [2];
  undefined1 local_3f8 [16];
  _func_int **local_3e8 [2];
  _func_int *local_3d8 [2];
  ios_base *local_3c8 [2];
  ios_base local_3b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  undefined1 local_398 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  undefined1 local_378 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  long local_358 [101];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_428,"   Gathering version information (one . per revision):\n    ",
             0x3b);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBZR.cxx"
               ,0x18a,(char *)local_4e0.super_LineParser.super_OutputParser._vptr_OutputParser,false
              );
  ppcVar1 = &local_4e0.super_LineParser.Prefix;
  if (local_4e0.super_LineParser.super_OutputParser._vptr_OutputParser != (_func_int **)ppcVar1) {
    operator_delete(local_4e0.super_LineParser.super_OutputParser._vptr_OutputParser,
                    (ulong)(local_4e0.super_LineParser.Prefix + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
  std::ios_base::~ios_base(local_3b8);
  this_00 = &(this->super_cmCTestGlobalVC).Revisions;
  std::__cxx11::_List_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::_M_clear
            (&this_00->super__List_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>);
  (this->super_cmCTestGlobalVC).Revisions.
  super__List_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->super_cmCTestGlobalVC).Revisions.
  super__List_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->super_cmCTestGlobalVC).Revisions.
  super__List_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl._M_node.
  _M_size = 0;
  local_4a0 = &local_490;
  local_498 = 0;
  local_490 = 0;
  __nptr = (this->super_cmCTestGlobalVC).OldRevision._M_dataplus._M_p;
  iVar5 = atoi(__nptr);
  iVar6 = atoi((this->super_cmCTestGlobalVC).NewRevision._M_dataplus._M_p);
  if (iVar5 <= iVar6) {
    local_4e0.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)ppcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4e0,__nptr,
               __nptr + (this->super_cmCTestGlobalVC).OldRevision._M_string_length);
    std::__cxx11::string::append((char *)&local_4e0);
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_4e0,
                                (ulong)(this->super_cmCTestGlobalVC).NewRevision._M_dataplus._M_p);
    pcVar4 = local_428 + 0x10;
    psVar8 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar8) {
      local_428._16_8_ = *psVar8;
      local_428._24_8_ = plVar7[3];
      local_428._0_8_ = pcVar4;
    }
    else {
      local_428._16_8_ = *psVar8;
      local_428._0_8_ = (size_type *)*plVar7;
    }
    local_428._8_8_ = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_4a0,(string *)local_428);
    if ((pointer)local_428._0_8_ != pcVar4) {
      operator_delete((void *)local_428._0_8_,local_428._16_8_ + 1);
    }
    if (local_4e0.super_LineParser.super_OutputParser._vptr_OutputParser != (_func_int **)ppcVar1) {
      operator_delete(local_4e0.super_LineParser.super_OutputParser._vptr_OutputParser,
                      (ulong)(local_4e0.super_LineParser.Prefix + 1));
    }
    pcVar3 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
    local_480 = local_470;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_480,pcVar3,
               pcVar3 + (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool.
                        _M_string_length);
    local_428._0_8_ = pcVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_428,local_480,local_478 + (long)local_480);
    local_408[0] = local_3f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"log","");
    local_3e8[0] = local_3d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"-v","");
    local_3c8[0] = local_3b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"-r","");
    local_3a8._M_allocated_capacity = (size_type)local_398;
    std::__cxx11::string::_M_construct<char*>((string *)&local_3a8,local_4a0,local_4a0 + local_498);
    local_388._M_allocated_capacity = (size_type)local_378;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"--xml","");
    plVar7 = local_358;
    pcVar4 = (this->URL)._M_dataplus._M_p;
    local_368._M_allocated_capacity = (size_type)plVar7;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_368,pcVar4,pcVar4 + (this->URL)._M_string_length);
    __l._M_len = 7;
    __l._M_array = (iterator)local_428;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_440,__l,(allocator_type *)&local_4e0);
    lVar9 = -0xe0;
    do {
      if (plVar7 != (long *)plVar7[-2]) {
        operator_delete((long *)plVar7[-2],*plVar7 + 1);
      }
      plVar7 = plVar7 + -4;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0);
    LogParser::LogParser((LogParser *)local_428,this,"log-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              (&local_4e0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"log-err> ");
    local_460._M_string_length = 0;
    local_460.field_2._M_local_buf[0] = '\0';
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
    cmCTestVC::RunChild((cmCTestVC *)this,&local_440,(OutputParser *)local_428,
                        (OutputParser *)&local_4e0,&local_460,Auto);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p,
                      CONCAT71(local_460.field_2._M_allocated_capacity._1_7_,
                               local_460.field_2._M_local_buf[0]) + 1);
    }
    local_4e0.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__LineParser_00bbdac8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0.super_LineParser.Line._M_dataplus._M_p !=
        &local_4e0.super_LineParser.Line.field_2) {
      operator_delete(local_4e0.super_LineParser.Line._M_dataplus._M_p,
                      local_4e0.super_LineParser.Line.field_2._M_allocated_capacity + 1);
    }
    LogParser::~LogParser((LogParser *)local_428);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
    std::ios::widen((char)(ostringstream *)local_428 +
                    (char)*(undefined8 *)(local_428._0_8_ + -0x18));
    std::ostream::put((char)local_428);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBZR.cxx"
                 ,0x19f,(char *)local_4e0.super_LineParser.super_OutputParser._vptr_OutputParser,
                 false);
    if (local_4e0.super_LineParser.super_OutputParser._vptr_OutputParser != (_func_int **)ppcVar1) {
      operator_delete(local_4e0.super_LineParser.super_OutputParser._vptr_OutputParser,
                      (ulong)(local_4e0.super_LineParser.Prefix + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
    std::ios_base::~ios_base(local_3b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_440);
    if (local_480 != local_470) {
      operator_delete(local_480,local_470[0] + 1);
    }
    if (local_4a0 != &local_490) {
      operator_delete(local_4a0,CONCAT71(uStack_48f,local_490) + 1);
    }
  }
  return true;
}

Assistant:

bool cmCTestBZR::LoadRevisions()
{
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   Gathering version information (one . per revision):\n"
             "    "
               << std::flush);

  // We are interested in every revision included in the update.
  this->Revisions.clear();
  std::string revs;
  if (atoi(this->OldRevision.c_str()) <= atoi(this->NewRevision.c_str())) {
    // DoRevision takes care of discarding the information about OldRevision
    revs = this->OldRevision + ".." + this->NewRevision;
  } else {
    return true;
  }

  // Run "bzr log" to get all global revisions of interest.
  std::string bzr = this->CommandLineTool;
  std::vector<std::string> bzr_log = { bzr,  "log",   "-v",     "-r",
                                       revs, "--xml", this->URL };
  {
    LogParser out(this, "log-out> ");
    OutputLogger err(this->Log, "log-err> ");
    this->RunChild(bzr_log, &out, &err);
  }
  cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl);
  return true;
}